

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::benchmarkFailed(ConsoleReporter *this,StringRef error)

{
  ColourGuard *rhs;
  TablePrinter *this_00;
  TablePrinter *pTVar1;
  long in_RDI;
  ColourGuard guard;
  StringRef *in_stack_ffffffffffffff78;
  TablePrinter *in_stack_ffffffffffffff80;
  ColourImpl *in_stack_ffffffffffffff88;
  ColourGuard local_28 [2];
  
  Detail::unique_ptr<Catch::ColourImpl>::operator->
            ((unique_ptr<Catch::ColourImpl> *)(in_RDI + 0x28));
  ColourImpl::guardColour
            (in_stack_ffffffffffffff88,(Code)((ulong)in_stack_ffffffffffffff80 >> 0x20));
  rhs = ColourImpl::ColourGuard::engage
                  ((ColourGuard *)in_stack_ffffffffffffff80,(ostream *)in_stack_ffffffffffffff78);
  ColourImpl::ColourGuard::ColourGuard(local_28,rhs);
  ColourImpl::ColourGuard::~ColourGuard((ColourGuard *)in_stack_ffffffffffffff80);
  Detail::unique_ptr<Catch::TablePrinter>::operator*
            ((unique_ptr<Catch::TablePrinter> *)(in_RDI + 0x90));
  Catch::operator<<(in_stack_ffffffffffffff80,(char (*) [19])in_stack_ffffffffffffff78);
  Catch::operator<<(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  this_00 = Catch::operator<<(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
  pTVar1 = Catch::operator<<(this_00);
  Catch::operator<<(pTVar1);
  ColourImpl::ColourGuard::~ColourGuard((ColourGuard *)this_00);
  return;
}

Assistant:

void ConsoleReporter::benchmarkFailed( StringRef error ) {
    auto guard = m_colour->guardColour( Colour::Red ).engage( m_stream );
    (*m_tablePrinter)
        << "Benchmark failed (" << error << ')'
        << ColumnBreak() << RowBreak();
}